

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaL_checktype(lua_State *L,int narg,int t)

{
  int iVar1;
  int in_EDX;
  undefined8 in_RDI;
  lua_State *unaff_retaddr;
  
  iVar1 = lua_type(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  if (iVar1 != in_EDX) {
    tag_error(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  return;
}

Assistant:

static void luaL_checktype(lua_State*L,int narg,int t){
if(lua_type(L,narg)!=t)
tag_error(L,narg,t);
}